

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

string * __thiscall
pbrt::Array2D<float>::ToString_abi_cxx11_(string *__return_storage_ptr__,Array2D<float> *this)

{
  float *pfVar1;
  Bounds2<int> *in_RCX;
  int y;
  int x;
  float value;
  float local_54;
  string local_50;
  
  StringPrintf<pbrt::Bounds2<int>const&>
            (__return_storage_ptr__,(pbrt *)"[ Array2D extent: %s values: [",(char *)this,in_RCX);
  for (y = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
      y < (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y; y = y + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (x = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
        x < (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x; x = x + 1) {
      pfVar1 = operator()(this,x,y);
      local_54 = *pfVar1;
      StringPrintf<float&>(&local_50,(pbrt *)"%s, ",(char *)&local_54,(float *)in_RCX);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        std::string s = StringPrintf("[ Array2D extent: %s values: [", extent);
        for (int y = extent.pMin.y; y < extent.pMax.y; ++y) {
            s += " [ ";
            for (int x = extent.pMin.x; x < extent.pMax.x; ++x) {
                T value = (*this)(x, y);
                s += StringPrintf("%s, ", value);
            }
            s += "], ";
        }
        s += " ] ]";
        return s;
    }